

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var __thiscall
Js::JavascriptNativeIntArray::DirectGetItem(JavascriptNativeIntArray *this,uint32 index)

{
  int iVar1;
  SparseArraySegmentBase *pSVar2;
  uint uVar3;
  Type *pTVar4;
  Type local_28;
  Var element;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(this);
  pSVar2 = JavascriptArray::GetLastUsedSegment((JavascriptArray *)this);
  uVar3 = index - pSVar2->left;
  if (((pSVar2->left <= index) && (uVar3 < pSVar2->length)) &&
     ((ulong)(&pSVar2[1].left)[uVar3] != 0xfff80002)) {
    return (Var)((ulong)(&pSVar2[1].left)[uVar3] | 0x1000000000000);
  }
  pTVar4 = &local_28;
  local_28.ptr = (RecyclableObject *)0x0;
  iVar1 = (**(code **)((long)(this->super_JavascriptNativeArray).super_JavascriptArray.
                             super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject + 0x388))
                    (this,index,pTVar4);
  if (iVar1 == 0) {
    pTVar4 = &(((((this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
                  super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).undefinedValue;
  }
  return pTVar4->ptr;
}

Assistant:

Var JavascriptNativeIntArray::DirectGetItem(uint32 index)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        SparseArraySegment<int32> *seg = (SparseArraySegment<int32>*)this->GetLastUsedSegment();
        uint32 offset = index - seg->left;
        if (index >= seg->left && offset < seg->length)
        {
            if (!SparseArraySegment<int32>::IsMissingItem(&seg->elements[offset]))
            {
                return JavascriptNumber::ToVar(seg->elements[offset], GetScriptContext());
            }
        }
        Var element = nullptr;
        if (DirectGetItemAtFull(index, &element))
        {
            return element;
        }
        return GetType()->GetLibrary()->GetUndefined();
    }